

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SettingsUI.cpp
# Opt level: O0

void __thiscall LTSettingsUI::LTSettingsUI(LTSettingsUI *this)

{
  undefined1 uVar1;
  int iVar2;
  string *psVar3;
  allocator<char> *paVar4;
  reference this_00;
  ImgWindow *this_01;
  long *in_RDI;
  size_t i;
  size_type in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  allocator<char> *__a;
  DataRefs *in_stack_fffffffffffffe78;
  string *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  string *this_04;
  int __val;
  undefined1 *local_c8;
  allocator<char> local_b9;
  string local_b8 [32];
  string local_98;
  WndStyle in_stack_ffffffffffffff88;
  WndMode in_stack_ffffffffffffff8c;
  LTImgWindow *in_stack_ffffffffffffff90;
  WndRect in_stack_ffffffffffffff98;
  string local_50 [32];
  allocator<char> *local_30;
  WndPos local_18;
  WndPos local_10;
  
  local_18 = dataRefs.SUIrect.tl;
  local_10 = dataRefs.SUIrect.br;
  LTImgWindow::LTImgWindow
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff98);
  *in_RDI = (long)&PTR__LTSettingsUI_0046dd00;
  *(undefined1 *)(in_RDI + 0x2b) = 0;
  local_c8 = (undefined1 *)((long)in_RDI + 0x159);
  do {
    *local_c8 = 0;
    local_c8 = local_c8 + 1;
  } while (local_c8 != (undefined1 *)((long)in_RDI + 0x18a));
  std::__cxx11::string::string((string *)(in_RDI + 0x32));
  std::__cxx11::string::string((string *)(in_RDI + 0x36));
  *(undefined1 *)(in_RDI + 0x3a) = 0;
  *(undefined4 *)((long)in_RDI + 0x1d4) = 0;
  psVar3 = DataRefs::GetADSBExAPIKey_abi_cxx11_(&dataRefs);
  std::__cxx11::string::string((string *)(in_RDI + 0x3b),(string *)psVar3);
  uVar1 = std::__cxx11::string::empty();
  *(undefined1 *)(in_RDI + 0x3f) = uVar1;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_14UL>
  ::array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_14UL>
           *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  std::__cxx11::string::string((string *)(in_RDI + 0x78));
  *(undefined1 *)(in_RDI + 0x7c) = 0;
  *(undefined4 *)(in_RDI + 0x7d) = 0;
  *(undefined4 *)((long)in_RDI + 0x3ec) = 0;
  *(undefined4 *)(in_RDI + 0x7e) = 0;
  *(undefined4 *)((long)in_RDI + 0x3f4) = 0;
  *(undefined4 *)(in_RDI + 0x7f) = 0;
  *(undefined4 *)((long)in_RDI + 0x3fc) = 0;
  *(undefined4 *)(in_RDI + 0x80) = 0;
  *(undefined4 *)((long)in_RDI + 0x404) = 0;
  *(undefined4 *)(in_RDI + 0x81) = 0;
  in_RDI[0x82] = 0;
  in_RDI[0x83] = 0;
  *(undefined1 *)(in_RDI + 0x84) = 0;
  *(undefined1 *)((long)in_RDI + 0x421) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x85));
  std::__cxx11::string::string((string *)(in_RDI + 0x89));
  std::__cxx11::string::string((string *)(in_RDI + 0x8d));
  *(undefined1 *)(in_RDI + 0x91) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x92));
  std::__cxx11::string::string((string *)(in_RDI + 0x96));
  *(undefined4 *)(in_RDI + 0x9a) = 0xffffffff;
  std::__cxx11::string::string((string *)(in_RDI + 0x9b));
  *(undefined1 *)(in_RDI + 0x9f) = 0;
  *(undefined1 *)((long)in_RDI + 0x4f9) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0xa0));
  *(undefined1 *)(in_RDI + 0xa4) = 0;
  *(undefined1 *)((long)in_RDI + 0x521) = 0;
  psVar3 = DataRefs::GetDefaultAcIcaoType_abi_cxx11_(&dataRefs);
  std::__cxx11::string::string((string *)(in_RDI + 0xa5),(string *)psVar3);
  *(undefined4 *)(in_RDI + 0xa9) = 0;
  psVar3 = DataRefs::GetDefaultCarIcaoType_abi_cxx11_(&dataRefs);
  std::__cxx11::string::string((string *)(in_RDI + 0xaa),(string *)psVar3);
  *(undefined4 *)(in_RDI + 0xae) = 0;
  DataRefs::GetDebugAcFilter_abi_cxx11_(in_stack_fffffffffffffe78);
  std::__cxx11::string::string((string *)(in_RDI + 0xb3),(string *)&dataRefs.cslFixAcIcaoType);
  this_04 = (string *)(in_RDI + 0xb7);
  std::__cxx11::string::string(this_04,(string *)&dataRefs.cslFixOpIcao);
  this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xbb);
  std::__cxx11::string::string((string *)this_03,(string *)&dataRefs.cslFixLivery);
  this_02 = (string *)(in_RDI + 0xbf);
  std::__cxx11::string::string(this_02);
  local_30 = (allocator<char> *)0x0;
  while (__a = local_30,
        paVar4 = (allocator<char> *)
                 std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_14UL>
                 ::size((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_14UL>
                         *)(in_RDI + 0x40)), __a < paVar4) {
    std::
    array<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_14UL>
    ::operator[]((array<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_14UL>
                  *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_03,(char *)this_02,__a);
    str_concat((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_04,this_03);
    this_00 = std::
              array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_14UL>
              ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_14UL>
                            *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    std::__cxx11::string::operator=((string *)this_00,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
    local_30 = local_30 + 1;
  }
  DataRefs::GetOpenSkyCredentials
            ((DataRefs *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  __val = (int)((ulong)this_04 >> 0x20);
  psVar3 = DataRefs::GetRTLicense_abi_cxx11_(&dataRefs);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x78),(string *)psVar3);
  iVar2 = DataRefs::GetCfgInt(DR_AC_KEY);
  std::__cxx11::to_string(__val);
  psVar3 = &local_98;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x85),(string *)psVar3);
  std::__cxx11::string::~string((string *)psVar3);
  DataRefs::GetFSCharterCredentials
            ((DataRefs *)CONCAT44(iVar2,in_stack_fffffffffffffe50),psVar3,in_stack_fffffffffffffe40)
  ;
  this_01 = (ImgWindow *)DataRefs::GetSIDisplayName_abi_cxx11_(&dataRefs);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x92),(string *)this_01);
  paVar4 = &local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,(char *)this_02,__a);
  ImgWindow::SetWindowTitle((ImgWindow *)CONCAT44(iVar2,in_stack_fffffffffffffe50),psVar3);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  ImgWindow::SetWindowResizingLimits(this_01,(int)((ulong)paVar4 >> 0x20),(int)paVar4,0,0x273fcb);
  (**(code **)(*in_RDI + 0x10))(in_RDI,1);
  in_RDI[0x26] = (long)"setup/configuration#settings-ui";
  return;
}

Assistant:

LTSettingsUI::LTSettingsUI () :
LTImgWindow(WND_MODE_FLOAT_CNT_VR,
            dataRefs.SUItransp ? WND_STYLE_HUD : WND_STYLE_SOLID,
            dataRefs.SUIrect),
// If there is no ADSBEx key yet then display any new entry in clear text,
// If a key is already defined, then by default obscure it
sADSBExKeyEntry     (dataRefs.GetADSBExAPIKey()),
bADSBExKeyClearText (sADSBExKeyEntry.empty()),
// Fill CSL type entry with current values
acTypeEntry     (dataRefs.GetDefaultAcIcaoType()),
gndVehicleEntry (dataRefs.GetDefaultCarIcaoType()),
// Fill debug entry texts with current values
txtDebugFilter  (dataRefs.GetDebugAcFilter()),
txtFixAcType    (dataRefs.cslFixAcIcaoType),
txtFixOp        (dataRefs.cslFixOpIcao),
txtFixLivery    (dataRefs.cslFixLivery)
{
    /// GNF_COUNT is not available in SettingsUI.h (due to order of include files), make _now_ sure that aFlarmAcTys has the correct size
    assert (aFlarmAcTys.size() == size_t(FAT_UAV)+1);
    
    // Fill Flarm aircraft types with current values
    for (size_t i = 0; i < aFlarmAcTys.size(); i++)
        aFlarmAcTys[i] = str_concat(dataRefs.aFlarmToIcaoAcTy[i], " ");
    
    // Fetch OpenSky credentials
    dataRefs.GetOpenSkyCredentials(sOpenSkyUser, sOpenSkyPwd);
    
    // Fetch RealTraffic license and port number
    sRTLicenseEntry = dataRefs.GetRTLicense();
    sRTPort = std::to_string(DataRefs::GetCfgInt(DR_CFG_RT_TRAFFIC_PORT));
    
    // Fetch FSC credentials
    dataRefs.GetFSCharterCredentials(sFSCUser, sFSCPwd);
    
    // Fetch SayIntentions configuration
    sSIDisplayName = dataRefs.GetSIDisplayName();

    // Set up window basics
    SetWindowTitle(SUI_WND_TITLE);
    SetWindowResizingLimits(SUI_RESIZE_LIMITS.tl.x, SUI_RESIZE_LIMITS.tl.y,
                            SUI_RESIZE_LIMITS.br.x, SUI_RESIZE_LIMITS.br.y);
    SetVisible(true);
    
    // Define Help URL to open for generic Help (?) button
    szHelpURL = HELP_SETTINGS;
}